

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O2

void test_interpolation_28(void)

{
  run("triple mustaches should interpolate without html escaping",
      "These characters should not be HTML escaped: {{{.}}}\n","\"& \\\" < >\"",(char *)0x0,
      "These characters should not be HTML escaped: & \" < >\n");
  return;
}

Assistant:

static void
test_interpolation_28(void)
{
    run(
        "triple mustaches should interpolate without html escaping",
        "These characters should not be HTML escaped: {{{.}}}\n",
        "\"& \\\" < >\"",
        NULL,
        "These characters should not be HTML escaped: & \" < >\n"
    );
}